

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O1

int Abc_NtkDetectObjClasses_rec
              (Abc_Obj_t *pObj,Vec_Int_t *vMap,Hsh_VecMan_t *pHash,Vec_Int_t *vTemp)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *p;
  int *piVar6;
  uint uVar7;
  int *piVar8;
  size_t __size;
  int *piVar9;
  int iVar10;
  int *piVar11;
  long lVar12;
  Vec_Int_t t;
  
  lVar5 = (long)pObj->Id;
  if ((lVar5 < 0) || (vMap->nSize <= pObj->Id)) {
LAB_002a60d2:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar7 = vMap->pArray[lVar5];
  if (uVar7 == 0xffffffff) {
    uVar7 = *(uint *)&pObj->field_0x14 & 0xf;
    if ((7 < uVar7) || ((0xa4U >> uVar7 & 1) == 0)) {
      __assert_fail("Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcDetect.c"
                    ,0x164,
                    "int Abc_NtkDetectObjClasses_rec(Abc_Obj_t *, Vec_Int_t *, Hsh_VecMan_t *, Vec_Int_t *)"
                   );
    }
    if ((pObj->vFanouts).nSize == 0) {
      vMap->pArray[lVar5] = 0;
      uVar7 = 0;
    }
    else {
      uVar7 = Abc_NtkDetectObjClasses_rec
                        ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanouts).pArray],vMap,pHash
                         ,vTemp);
      if ((pObj->vFanouts).nSize == 1) {
        iVar10 = pObj->Id;
        if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) {
LAB_002a618c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[iVar10] = uVar7;
      }
      else {
        p = (Vec_Int_t *)malloc(0x10);
        p->nCap = 0x10;
        p->nSize = 0;
        piVar6 = (int *)malloc(0x40);
        p->pArray = piVar6;
        if (((int)uVar7 < 0) || (pHash->vMap->nSize <= (int)uVar7)) goto LAB_002a60d2;
        iVar10 = pHash->vMap->pArray[uVar7];
        if (((long)iVar10 < 0) || (pHash->vData->nSize <= iVar10)) {
LAB_002a60f1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar6 = pHash->vData->pArray + iVar10;
        iVar10 = *piVar6;
        (pHash->vTemp).nCap = iVar10;
        (pHash->vTemp).nSize = iVar10;
        (pHash->vTemp).pArray = piVar6 + 2;
        p->nSize = 0;
        if (0 < iVar10) {
          lVar5 = 0;
          do {
            Vec_IntPush(p,(pHash->vTemp).pArray[lVar5]);
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pHash->vTemp).nSize);
        }
        if (0 < (pObj->vFanouts).nSize) {
          lVar5 = 0;
          do {
            if (lVar5 != 0) {
              uVar7 = Abc_NtkDetectObjClasses_rec
                                ((Abc_Obj_t *)
                                 pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar5]],vMap,
                                 pHash,vTemp);
              if (((int)uVar7 < 0) || (pHash->vMap->nSize <= (int)uVar7)) goto LAB_002a60d2;
              iVar10 = pHash->vMap->pArray[uVar7];
              if (((long)iVar10 < 0) || (pHash->vData->nSize <= iVar10)) goto LAB_002a60f1;
              piVar6 = pHash->vData->pArray + iVar10;
              iVar10 = *piVar6;
              (pHash->vTemp).nCap = iVar10;
              (pHash->vTemp).nSize = iVar10;
              (pHash->vTemp).pArray = piVar6 + 2;
              iVar1 = p->nSize;
              lVar12 = (long)iVar10 + (long)iVar1;
              iVar10 = (int)lVar12;
              if (vTemp->nCap < iVar10) {
                __size = lVar12 * 4;
                if (vTemp->pArray == (int *)0x0) {
                  piVar6 = (int *)malloc(__size);
                }
                else {
                  piVar6 = (int *)realloc(vTemp->pArray,__size);
                }
                vTemp->pArray = piVar6;
                if (piVar6 == (int *)0x0) {
                  __assert_fail("p->pArray",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
                }
                vTemp->nCap = iVar10;
              }
              piVar2 = vTemp->pArray;
              piVar9 = p->pArray;
              piVar8 = (pHash->vTemp).pArray;
              piVar6 = piVar9 + iVar1;
              iVar10 = (pHash->vTemp).nSize;
              piVar3 = piVar8 + iVar10;
              piVar11 = piVar2;
              if (0 < iVar10 && 0 < iVar1) {
                do {
                  iVar10 = *piVar9;
                  iVar1 = *piVar8;
                  if (iVar10 == iVar1) {
                    piVar9 = piVar9 + 1;
                    *piVar11 = iVar10;
                    piVar8 = piVar8 + 1;
                  }
                  else if (iVar10 < iVar1) {
                    piVar9 = piVar9 + 1;
                    *piVar11 = iVar10;
                  }
                  else {
                    piVar8 = piVar8 + 1;
                    *piVar11 = iVar1;
                  }
                  piVar11 = piVar11 + 1;
                } while ((piVar9 < piVar6) && (piVar8 < piVar3));
              }
              for (; piVar9 < piVar6; piVar9 = piVar9 + 1) {
                *piVar11 = *piVar9;
                piVar11 = piVar11 + 1;
              }
              for (; piVar8 < piVar3; piVar8 = piVar8 + 1) {
                *piVar11 = *piVar8;
                piVar11 = piVar11 + 1;
              }
              iVar10 = (int)((ulong)((long)piVar11 - (long)piVar2) >> 2);
              vTemp->nSize = iVar10;
              if (vTemp->nCap < iVar10) {
                __assert_fail("vArr->nSize <= vArr->nCap",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x722,
                              "void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              if (iVar10 < p->nSize) {
                __assert_fail("vArr->nSize >= vArr1->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x723,
                              "void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              if (iVar10 < (pHash->vTemp).nSize) {
                __assert_fail("vArr->nSize >= vArr2->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x724,
                              "void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
              }
              iVar1 = p->nCap;
              iVar4 = p->nSize;
              piVar6 = p->pArray;
              iVar10 = vTemp->nSize;
              piVar3 = vTemp->pArray;
              p->nCap = vTemp->nCap;
              p->nSize = iVar10;
              p->pArray = piVar3;
              vTemp->nCap = iVar1;
              vTemp->nSize = iVar4;
              vTemp->pArray = piVar6;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pObj->vFanouts).nSize);
        }
        uVar7 = Hsh_VecManAdd(pHash,p);
        iVar10 = pObj->Id;
        if (((long)iVar10 < 0) || (vMap->nSize <= iVar10)) goto LAB_002a618c;
        vMap->pArray[iVar10] = uVar7;
        if (p->pArray != (int *)0x0) {
          free(p->pArray);
          p->pArray = (int *)0x0;
        }
        free(p);
      }
    }
  }
  return uVar7;
}

Assistant:

int Abc_NtkDetectObjClasses_rec( Abc_Obj_t * pObj, Vec_Int_t * vMap, Hsh_VecMan_t * pHash, Vec_Int_t * vTemp )
{
    Vec_Int_t * vArray, * vSet;
    Abc_Obj_t * pNext; int i;
    // get the CO set for this object
    int Entry = Vec_IntEntry(vMap, Abc_ObjId(pObj));
    if ( Entry != -1 ) // the set is already computed
        return Entry;
    // compute a new CO set
    assert( Abc_ObjIsCi(pObj) || Abc_ObjIsNode(pObj) );
    // if there is no fanouts, the set of COs is empty
    if ( Abc_ObjFanoutNum(pObj) == 0 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), 0 );
        return 0;
    }
    // compute the set for the first fanout
    Entry = Abc_NtkDetectObjClasses_rec( Abc_ObjFanout0(pObj), vMap, pHash, vTemp );
    if ( Abc_ObjFanoutNum(pObj) == 1 )
    {
        Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
        return Entry;
    }
    vSet = Vec_IntAlloc( 16 );
    // initialize the set with that of first fanout
    vArray = Hsh_VecReadEntry( pHash, Entry );
    Vec_IntClear( vSet );
    Vec_IntAppend( vSet, vArray );
    // iteratively add sets of other fanouts
    Abc_ObjForEachFanout( pObj, pNext, i )
    {
        if ( i == 0 ) 
            continue;
        Entry = Abc_NtkDetectObjClasses_rec( pNext, vMap, pHash, vTemp );
        vArray = Hsh_VecReadEntry( pHash, Entry );
        Vec_IntTwoMerge2( vSet, vArray, vTemp );
        ABC_SWAP( Vec_Int_t, *vSet, *vTemp );
    }
    // create or find new set and map the object into it
    Entry = Hsh_VecManAdd( pHash, vSet );
    Vec_IntWriteEntry( vMap, Abc_ObjId(pObj), Entry );
    Vec_IntFree( vSet );
    return Entry;
}